

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void spell_power_word_kill(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  act("$n points a finger at $N and utters the word, \'Die\'.",ch,(void *)0x0,vo,1);
  act("$n points a finger at you and utters the word, \'Die\'.",ch,(void *)0x0,vo,2);
  send_to_char("You intone a word of unholy power.\n\r",ch);
  iVar2 = 5;
  do {
    bVar1 = saves_spell(level + -1,(CHAR_DATA *)vo,9);
    iVar3 = iVar3 + (uint)bVar1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  bVar1 = is_immortal(ch);
  if ((bVar1) && (*(short *)((long)vo + 0x138) < ch->level)) {
    iVar3 = 0;
  }
  if (iVar3 != 0) {
    iVar2 = dice(level,0xe);
    damage_new(ch,(CHAR_DATA *)vo,iVar2 / iVar3,sn,9,true,true,0,1,(char *)0x0);
    return;
  }
  act("$N shudders in shock as $S heart explodes!",ch,(void *)0x0,vo,1);
  send_to_char("You feel your heart rupture in a violent explosion of pain!\n\r",(CHAR_DATA *)vo);
  act("Your word of power vaporizes $N\'s heart, killing $M instantly!",ch,(void *)0x0,vo,3);
  raw_kill(ch,(CHAR_DATA *)vo);
  return;
}

Assistant:

void spell_power_word_kill(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, saves, modify;

	saves = 0;

	act("$n points a finger at $N and utters the word, 'Die'.", ch, nullptr, victim, TO_NOTVICT);
	act("$n points a finger at you and utters the word, 'Die'.", ch, nullptr, victim, TO_VICT);
	send_to_char("You intone a word of unholy power.\n\r", ch);

	for (modify = 0; modify < 5; modify++)
	{
		if (saves_spell(level - 1, victim, DAM_NEGATIVE))
			saves++;
	}

	if (is_immortal(ch) && (victim->level < ch->level))
	{
		saves = 0;
	}

	if (saves == 0)
	{
		act("$N shudders in shock as $S heart explodes!", ch, nullptr, victim, TO_NOTVICT);
		send_to_char("You feel your heart rupture in a violent explosion of pain!\n\r", victim);
		act("Your word of power vaporizes $N's heart, killing $M instantly!", ch, nullptr, victim, TO_CHAR);
		raw_kill(ch, victim);
		return;
	}

	dam = dice(level, 14);
	dam /= saves;

	damage_old(ch, victim, dam, sn, DAM_NEGATIVE, true);
}